

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_10(QPDF *pdf,char *arg2)

{
  reference pvVar1;
  QPDFWriter local_e8 [8];
  QPDFWriter w;
  allocator<char> local_d1;
  string local_d0 [32];
  QPDFObjectHandle local_b0;
  allocator<char> local_99;
  string local_98 [32];
  QPDFObjectHandle local_78;
  reference local_68;
  QPDFPageObjectHelper *ph;
  QPDFPageDocumentHelper local_50;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_30 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_50,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_50);
  pvVar1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at(local_30,0);
  local_68 = pvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"BT /F1 12 Tf 72 620 Td (Baked) Tj ET\n",&local_99);
  QPDFObjectHandle::newStream((QPDF *)&local_78,(string *)pdf);
  QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)pvVar1,SUB81(&local_78,0));
  QPDFObjectHandle::~QPDFObjectHandle(&local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  pvVar1 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"BT /F1 18 Tf 72 520 Td (Mashed) Tj ET\n",&local_d1);
  QPDFObjectHandle::newStream((QPDF *)&local_b0,(string *)pdf);
  QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)pvVar1,SUB81(&local_b0,0));
  QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  QPDFWriter::QPDFWriter(local_e8,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_e8,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_e8);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_e8);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_30);
  return;
}

Assistant:

static void
test_10(QPDF& pdf, char const* arg2)
{
    std::vector<QPDFPageObjectHelper> pages = QPDFPageDocumentHelper(pdf).getAllPages();
    QPDFPageObjectHelper& ph(pages.at(0));
    ph.addPageContents(
        QPDFObjectHandle::newStream(&pdf, "BT /F1 12 Tf 72 620 Td (Baked) Tj ET\n"), true);
    ph.addPageContents(
        QPDFObjectHandle::newStream(&pdf, "BT /F1 18 Tf 72 520 Td (Mashed) Tj ET\n"), false);

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}